

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_address_tests.cpp
# Opt level: O0

void __thiscall IpAddressTests_ToFromLong_Test::TestBody(IpAddressTests_ToFromLong_Test *this)

{
  address *this_00;
  int *index;
  bool bVar1;
  char *pcVar2;
  reference lhs;
  reference rhs;
  AssertHelper local_80;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  address local_58;
  int i;
  address test_addr;
  Message local_48 [3];
  long local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  uint32_t value;
  address addr;
  IpAddressTests_ToFromLong_Test *this_local;
  
  this_00 = (address *)((long)&gtest_ar.message_.ptr_ + 4);
  ip::address::address(this_00,0xc0,'\x01','\x01','\v');
  gtest_ar.message_.ptr_._0_4_ = ip::to_uint32(this_00);
  local_30 = 0xc001010b;
  testing::internal::EqHelper<false>::Compare<unsigned_int,long>
            ((EqHelper<false> *)local_28,"value","3221291275",(uint *)&gtest_ar.message_,&local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&test_addr,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&test_addr,local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&test_addr);
    testing::Message::~Message(local_48);
  }
  i = (int)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (i == 0) {
    ip::address::address(&local_58,(uint32_t)gtest_ar.message_.ptr_);
    for (gtest_ar_1.message_.ptr_._4_4_ = 0; gtest_ar_1.message_.ptr_._4_4_ < 4;
        gtest_ar_1.message_.ptr_._4_4_ = gtest_ar_1.message_.ptr_._4_4_ + 1) {
      index = (int *)((long)&gtest_ar_1.message_.ptr_ + 4);
      lhs = ip::address::operator[]((address *)((long)&gtest_ar.message_.ptr_ + 4),index);
      rhs = ip::address::operator[](&local_58,index);
      testing::internal::EqHelper<false>::Compare<unsigned_char,unsigned_char>
                ((EqHelper<false> *)local_70,"addr[i]","test_addr[i]",lhs,rhs);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
      if (!bVar1) {
        testing::Message::Message(&local_78);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp"
                   ,0x46,pcVar2);
        testing::internal::AssertHelper::operator=(&local_80,&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        testing::Message::~Message(&local_78);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
    }
  }
  return;
}

Assistant:

TEST(IpAddressTests, ToFromLong)
{
    ip::address addr = { 192, 1, 1, 11 };
    auto value = ip::to_uint32(addr);
    ASSERT_EQ(value, 3221291275);

    ip::address test_addr(value);

    for(auto i = 0; i < 4; i++)
    {
        EXPECT_EQ(addr[i], test_addr[i]);
    }
}